

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O2

int thread_pool_worker(void *data)

{
  mtx_t *pmVar1;
  long lVar2;
  work_queue *queue;
  size_t sVar3;
  work_item *pwVar4;
  work_item *pwVar5;
  _Bool _Var6;
  int iVar7;
  
  lVar2 = *data;
  queue = *(work_queue **)((long)data + 8);
  sVar3 = *(size_t *)((long)data + 0x10);
  pmVar1 = &queue->mutex;
  do {
    mtx_lock(pmVar1);
    while (pwVar4 = queue->first_item, pwVar4 == (work_item *)0x0) {
      if ((*(char *)(lVar2 + 0x10) != '\0') ||
         (iVar7 = cnd_wait(&queue->avail_cond,pmVar1), iVar7 != 0)) {
        mtx_unlock(pmVar1);
        return 0;
      }
    }
    pwVar5 = pwVar4->next;
    queue->first_item = pwVar5;
    if (pwVar5 == (work_item *)0x0) {
      if (queue->last_item != pwVar4) {
        __assert_fail("queue->last_item == item",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/core/thread_pool.c"
                      ,0x4f,"int thread_pool_worker(void *)");
      }
      queue->last_item = (work_item *)0x0;
    }
    queue->worked_on = queue->worked_on + 1;
    mtx_unlock(pmVar1);
    (*pwVar4->work_fn)(pwVar4,sVar3);
    mtx_lock(pmVar1);
    pwVar4->next = queue->done_items;
    queue->done_items = pwVar4;
    queue->worked_on = queue->worked_on - 1;
    queue->done_count = queue->done_count + 1;
    _Var6 = waiting_condition(queue);
    if (!_Var6) {
      cnd_signal(&queue->done_cond);
    }
    mtx_unlock(pmVar1);
  } while( true );
}

Assistant:

static int thread_pool_worker(void* data) {
    struct thread_data* thread_data = data;
    struct work_queue* queue = thread_data->queue;
    struct thread_pool* thread_pool = thread_data->thread_pool;
    size_t thread_id = thread_data->thread_id;
    while (true) {
        mtx_lock(&queue->mutex);
        while (!queue->first_item) {
            if (thread_pool->should_stop || cnd_wait(&queue->avail_cond, &queue->mutex) != thrd_success)
                goto end;
        }
        struct work_item* item = queue->first_item;
        queue->first_item = item->next;
        if (!queue->first_item) {
            assert(queue->last_item == item);
            queue->last_item = NULL;
        }
        queue->worked_on++;
        mtx_unlock(&queue->mutex);

        item->work_fn(item, thread_id);

        mtx_lock(&queue->mutex);
        item->next = queue->done_items;
        queue->done_items = item;
        queue->worked_on--;
        queue->done_count++;
        if (!waiting_condition(queue))
            cnd_signal(&queue->done_cond);
        mtx_unlock(&queue->mutex);
    }
end:
    mtx_unlock(&queue->mutex);
    return 0;
}